

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.c
# Opt level: O0

int nsync_wait_n(void *mu,_func_void_void_ptr *lock,_func_void_void_ptr *unlock,
                nsync_time abs_deadline,int count,nsync_waitable_s **waitable)

{
  nsync_time nVar1;
  int iVar2;
  waiter *w_00;
  bool bVar3;
  bool bVar4;
  nsync_time a;
  int was_still_enqueued;
  nsync_time ntime;
  nsync_time min_ntime;
  nsync_waiter_s *nw;
  nsync_waiter_s nw_set [4];
  waiter *w;
  int enqueued;
  int j;
  int unlocked;
  int i;
  int local_38;
  int ready;
  int count_local;
  _func_void_void_ptr *unlock_local;
  _func_void_void_ptr *lock_local;
  void *mu_local;
  nsync_time abs_deadline_local;
  
  local_38 = 0;
  while( true ) {
    bVar3 = false;
    if (local_38 != count) {
      nVar1 = (*waitable[local_38]->funcs->ready_time)(waitable[local_38]->v,(nsync_waiter_s *)0x0);
      iVar2 = nsync_time_cmp(nVar1,(nsync_time)ZEXT816((ulong)0));
      bVar3 = 0 < iVar2;
    }
    if (!bVar3) break;
    local_38 = local_38 + 1;
  }
  if ((local_38 == count) &&
     (iVar2 = nsync_time_cmp(abs_deadline,(nsync_time)ZEXT816((ulong)0)), 0 < iVar2)) {
    bVar3 = false;
    w._0_4_ = 1;
    w_00 = nsync_waiter_new_();
    min_ntime.tv_nsec = (__syscall_slong_t)&nw;
    if (4 < count) {
      min_ntime.tv_nsec = (__syscall_slong_t)malloc((long)count * 0x38);
    }
    for (j = 0; j != count && (int)w != 0; j = j + 1) {
      *(undefined4 *)(min_ntime.tv_nsec + (long)j * 0x38) = 0x726d2ba9;
      *(nsync_semaphore **)(min_ntime.tv_nsec + (long)j * 0x38 + 0x28) = &w_00->sem;
      nsync_dll_init_((nsync_dll_element_ *)(min_ntime.tv_nsec + (long)j * 0x38 + 8),
                      (void *)(min_ntime.tv_nsec + (long)j * 0x38));
      *(undefined4 *)(min_ntime.tv_nsec + (long)j * 0x38 + 0x20) = 0;
      *(undefined4 *)(min_ntime.tv_nsec + (long)j * 0x38 + 0x30) = 0;
      w._0_4_ = (*waitable[j]->funcs->enqueue)
                          (waitable[j]->v,(nsync_waiter_s *)(min_ntime.tv_nsec + (long)j * 0x38));
    }
    if (j == count) {
      bVar3 = mu != (void *)0x0;
      if (bVar3) {
        (*unlock)(mu);
      }
      do {
        nVar1 = abs_deadline;
        for (w._4_4_ = 0; w._4_4_ != count; w._4_4_ = w._4_4_ + 1) {
          a = (*waitable[w._4_4_]->funcs->ready_time)
                        (waitable[w._4_4_]->v,
                         (nsync_waiter_s *)(min_ntime.tv_nsec + (long)w._4_4_ * 0x38));
          iVar2 = nsync_time_cmp(a,nVar1);
          if (iVar2 < 0) {
            nVar1 = a;
          }
        }
        iVar2 = nsync_time_cmp(nVar1,(nsync_time)ZEXT816((ulong)0));
        bVar4 = false;
        if (0 < iVar2) {
          iVar2 = nsync_mu_semaphore_p_with_deadline(&w_00->sem,nVar1);
          bVar4 = iVar2 == 0;
        }
      } while (bVar4);
    }
    for (w._4_4_ = 0; w._4_4_ != j; w._4_4_ = w._4_4_ + 1) {
      iVar2 = (*waitable[w._4_4_]->funcs->dequeue)
                        (waitable[w._4_4_]->v,
                         (nsync_waiter_s *)(min_ntime.tv_nsec + (long)w._4_4_ * 0x38));
      if ((iVar2 == 0) && (local_38 == count)) {
        local_38 = w._4_4_;
      }
    }
    if ((nsync_waiter_s **)min_ntime.tv_nsec != &nw) {
      free((void *)min_ntime.tv_nsec);
    }
    nsync_waiter_free_(w_00);
    if (bVar3) {
      (*lock)(mu);
    }
  }
  return local_38;
}

Assistant:

NSYNC_CPP_START_

int nsync_wait_n (void *mu, void (*lock) (void *), void (*unlock) (void *),
		  nsync_time abs_deadline,
		  int count, struct nsync_waitable_s *waitable[]) {
	int ready;
	IGNORE_RACES_START ();
	for (ready = 0; ready != count &&
			nsync_time_cmp ((*waitable[ready]->funcs->ready_time) (
						waitable[ready]->v, NULL),
					nsync_time_zero) > 0;
	     ready++) {
	}
	if (ready == count && nsync_time_cmp (abs_deadline, nsync_time_zero) > 0) {
		int i;
		int unlocked = 0;
		int j;
		int enqueued = 1;
		waiter *w = nsync_waiter_new_ ();
		struct nsync_waiter_s nw_set[4];
		struct nsync_waiter_s *nw = nw_set;
		if (count > (int) (sizeof (nw_set) / sizeof (nw_set[0]))) {
			nw = (struct nsync_waiter_s *) malloc (count * sizeof (nw[0]));
		}
		for (i = 0; i != count && enqueued; i++) {
			nw[i].tag = NSYNC_WAITER_TAG;
			nw[i].sem = &w->sem;
			nsync_dll_init_ (&nw[i].q, &nw[i]);
			ATM_STORE (&nw[i].waiting, 0);
			nw[i].flags = 0;
			enqueued = (*waitable[i]->funcs->enqueue) (waitable[i]->v, &nw[i]);
		}

		if (i == count) {
			nsync_time min_ntime;
			if (mu != NULL) {
				(*unlock) (mu);
				unlocked = 1;
			}
			do {
				min_ntime = abs_deadline;
				for (j = 0; j != count; j++) {
					nsync_time ntime;
					ntime = (*waitable[j]->funcs->ready_time) (
						waitable[j]->v, &nw[j]);
					if (nsync_time_cmp (ntime, min_ntime) < 0) {
						min_ntime = ntime;
					}
				}
			} while (nsync_time_cmp (min_ntime, nsync_time_zero) > 0 &&
				 nsync_mu_semaphore_p_with_deadline (&w->sem,
					min_ntime) == 0);
		}

		/* An attempt was made above to enqueue waitable[0..i-1].
                   Dequeue any that are still enqueued, and remember the index
                   of the first ready (i.e., not still enqueued) object, if any.  */
		for (j = 0; j != i; j++) {
			int was_still_enqueued =
				(*waitable[j]->funcs->dequeue) (waitable[j]->v, &nw[j]);
			if (!was_still_enqueued && ready == count) {
				ready = j;
			}
		}

		if (nw != nw_set) {
			free (nw);
		}
		nsync_waiter_free_ (w);
		if (unlocked) {
			(*lock) (mu);
		}
	}
	IGNORE_RACES_END ();
	return (ready);
}